

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O1

int modrm_dec(pt_ild *ild,uint8_t length)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pti_modrm pVar7;
  
  bVar1 = ild->map;
  iVar5 = -0xe;
  iVar6 = -0xe;
  if (7 < bVar1) {
    return -0xe;
  }
  puVar3 = has_modrm_table[ild->vex][bVar1].table;
  if (puVar3 == (uint8_t *)0x0) {
    pVar7 = has_modrm_table[ild->vex][bVar1].has_modrm;
  }
  else {
    pVar7 = (pti_modrm)puVar3[ild->nominal_opcode];
  }
  switch(pVar7) {
  case PTI_MODRM_FALSE:
  case PTI_MODRM_UNDEF:
    goto switchD_0010a544_caseD_0;
  case PTI_MODRM_TRUE:
    if (length < ild->max_bytes) {
      bVar1 = eamode_table[0][(ulong)ild->mode + (ulong)(*(ushort *)&ild->field_0x10 & 2) * 2];
      bVar2 = ild->itext[length];
      ild->modrm_byte = bVar2;
      ild->disp_bytes = disp_default[bVar1][bVar2 >> 6][bVar2 & 7];
      if (has_sib[bVar1][bVar2 >> 6][bVar2 & 7] != '\0') {
        if ((byte)(length + 1) < ild->max_bytes) {
          if ((bVar2 < 0x40) && ((ild->itext[(byte)(length + 1)] & 7) == 5)) {
            ild->disp_bytes = '\x04';
          }
          iVar5 = disp_dec(ild,length + '\x02');
        }
        goto LAB_0010a5e5;
      }
      bVar4 = true;
      iVar6 = iVar5;
    }
    else {
LAB_0010a5e5:
      bVar4 = false;
      iVar6 = iVar5;
    }
    if (!bVar4) {
switchD_0010a544_default:
      return iVar6;
    }
    break;
  case PTI_MODRM_IGNORE_MOD:
    if (ild->max_bytes <= length) {
      return -0xe;
    }
    ild->modrm_byte = ild->itext[length];
    break;
  default:
    goto switchD_0010a544_default;
  }
  length = length + '\x01';
switchD_0010a544_caseD_0:
  iVar6 = disp_dec(ild,length);
  return iVar6;
}

Assistant:

static int modrm_dec(struct pt_ild *ild, uint8_t length)
{
	const struct pti_modrm_desc *desc;
	const uint8_t *table;
	enum pti_modrm has_modrm;
	pti_map_enum_t map;

	if (!ild)
		return -pte_internal;

	map = pti_get_map(ild);
	if (PTI_MAP_INVALID <= map)
		return -pte_bad_insn;

	desc = &has_modrm_table[ild->vex][map];
	table = desc->table;
	has_modrm = table ? table[ild->nominal_opcode] : desc->has_modrm;
	switch (has_modrm) {
	case PTI_MODRM_FALSE:
	case PTI_MODRM_UNDEF:
		return disp_dec(ild, length);

	case PTI_MODRM_IGNORE_MOD:
		if (length >= ild->max_bytes)
			return -pte_bad_insn;

		ild->modrm_byte = get_byte(ild, length);
		return disp_dec(ild, length + 1);

	case PTI_MODRM_TRUE: {
		uint8_t eamode = eamode_table[ild->asz][ild->mode];
		uint8_t mod, rm, sib;

		if (length >= ild->max_bytes)
			return -pte_bad_insn;

		ild->modrm_byte = get_byte(ild, length);
		mod = pti_get_modrm_mod(ild);
		rm = pti_get_modrm_rm(ild);

		ild->disp_bytes = disp_default[eamode][mod][rm];
		sib = has_sib[eamode][mod][rm];
		if (sib)
			return sib_dec(ild, length + 1);
	}
		return disp_dec(ild, length + 1);
	}

	return -pte_bad_insn;
}